

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<CRYPTO_BUFFER> __thiscall
bssl::anon_unknown_0::BufferFromPEM(anon_unknown_0 *this,char *pem)

{
  int iVar1;
  size_t sVar2;
  CRYPTO_BUFFER *pCVar3;
  uint8_t *data;
  UniquePtr<BIO> bio;
  long data_len;
  char *header;
  char *name;
  uint8_t *local_38;
  __uniq_ptr_impl<bio_st,_bssl::internal::Deleter> local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  
  sVar2 = strlen(pem);
  local_30._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
       (tuple<bio_st_*,_bssl::internal::Deleter>)BIO_new_mem_buf(pem,(int)sVar2);
  iVar1 = PEM_read_bio((BIO *)local_30._M_t.
                              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&local_18,
                       &local_20,&local_38,(long *)&local_28);
  if (iVar1 == 0) {
    *(undefined8 *)this = 0;
  }
  else {
    OPENSSL_free(local_18);
    OPENSSL_free(local_20);
    pCVar3 = CRYPTO_BUFFER_new(local_38,local_28,(CRYPTO_BUFFER_POOL *)0x0);
    *(CRYPTO_BUFFER **)this = pCVar3;
    OPENSSL_free(local_38);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&local_30);
  return (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<CRYPTO_BUFFER> BufferFromPEM(const char *pem) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(pem, strlen(pem)));
  char *name, *header;
  uint8_t *data;
  long data_len;
  if (!PEM_read_bio(bio.get(), &name, &header, &data, &data_len)) {
    return nullptr;
  }
  OPENSSL_free(name);
  OPENSSL_free(header);

  auto ret = bssl::UniquePtr<CRYPTO_BUFFER>(
      CRYPTO_BUFFER_new(data, data_len, nullptr));
  OPENSSL_free(data);
  return ret;
}